

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t _elemsize;
  int *piVar6;
  float *pfVar7;
  long lVar8;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  long lVar14;
  undefined4 in_EAX;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  void *pvVar25;
  ulong uVar26;
  ulong uVar27;
  void *pvVar28;
  size_type __n;
  long lVar29;
  uint uVar30;
  void *pvVar31;
  undefined4 uVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  int iVar40;
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  int iVar43;
  undefined1 auVar42 [16];
  int size_1;
  int size;
  vector<int,_std::allocator<int>_> _space_ofs;
  ulong local_1f0;
  long local_1d8;
  void *local_1d0;
  allocator_type local_1c1;
  ulong local_1c0;
  ulong local_1b8;
  void *local_1b0;
  long local_1a8;
  ulong local_1a0;
  Mat *local_198;
  void *local_190;
  ulong local_188;
  long local_180;
  Mat local_178;
  undefined1 local_128 [16];
  ulong local_118;
  ulong local_110;
  void *local_108;
  ulong local_100;
  long local_f8;
  ulong local_f0;
  int local_e4;
  int local_e0;
  int local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Option *local_b8;
  ulong local_b0;
  void *local_a8;
  long local_a0;
  void *local_98;
  long local_90;
  void *local_88;
  long local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  long local_60;
  void *local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar20 = bottom_blob->w;
  iVar24 = bottom_blob->h;
  iVar40 = this->kernel_w;
  iVar43 = this->dilation_w;
  local_d8._8_8_ = local_d8._0_8_;
  local_d8._0_8_ = bottom_blob;
  _elemsize = bottom_blob->elemsize;
  iVar2 = this->stride_w;
  iVar3 = this->kernel_h;
  iVar4 = this->dilation_h;
  iVar16 = this->stride_h;
  iVar19 = this->output_pad_right;
  iVar22 = this->output_pad_bottom;
  local_178.cstep = 0;
  local_178.data = (void *)0x0;
  local_178.refcount._0_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.elemsize = 0;
  local_178.elempack = 0;
  local_178.allocator = (Allocator *)0x0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.d = 0;
  local_178.c = 0;
  auVar34._0_4_ = -(uint)(0 < this->pad_left);
  auVar34._4_4_ = -(uint)(0 < this->pad_right);
  auVar34._8_4_ = -(uint)(0 < this->pad_top);
  auVar34._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar15 = movmskps(in_EAX,auVar34);
  lVar29 = 0x10;
  if ((iVar15 == 0) &&
     (((this->output_w < 1 || (this->output_h < 1)) && (lVar29 = 8, &local_178 != top_blob)))) {
    piVar6 = top_blob->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    local_178.data = top_blob->data;
    local_178.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_178.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_178.elemsize = top_blob->elemsize;
    local_178.elempack = top_blob->elempack;
    local_178.allocator = top_blob->allocator;
    uVar10 = top_blob->dims;
    uVar11 = top_blob->w;
    uVar12 = top_blob->h;
    uVar13 = top_blob->d;
    local_178.c = top_blob->c;
    local_178.cstep = top_blob->cstep;
    local_178.dims = uVar10;
    local_178.w = uVar11;
    local_178.h = uVar12;
    local_178.d = uVar13;
  }
  local_198 = top_blob;
  local_b8 = opt;
  Mat::create(&local_178,iVar19 + (iVar40 + -1) * iVar43 + (iVar20 + -1) * iVar2 + 1,
              iVar22 + 1 + (iVar3 + -1) * iVar4 + (iVar24 + -1) * iVar16,this->num_output,_elemsize,
              *(Allocator **)(&opt->lightmode + lVar29));
  iVar20 = local_178.w;
  iVar24 = -100;
  if (local_178.data != (void *)0x0) {
    local_128._0_8_ = (long)local_178.c;
    if (local_178.cstep * (long)local_178.c != 0) {
      iVar24 = this->kernel_w;
      iVar40 = this->kernel_h;
      local_90 = (long)this->stride_w;
      iVar43 = this->stride_h;
      iVar2 = this->dilation_w;
      iVar3 = this->dilation_h;
      local_b0 = (ulong)(uint)this->group;
      local_1b8 = (ulong)(uint)this->activation_type;
      iVar4 = *(int *)(local_d8._0_8_ + 0x38);
      uVar30 = iVar24 * iVar40;
      __n = (size_type)(int)uVar30;
      std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_1c1);
      if (0 < iVar40) {
        iVar16 = 0;
        iVar19 = 0;
        iVar22 = 0;
        do {
          if (0 < iVar24) {
            lVar29 = 0;
            do {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar16 + lVar29] = iVar19;
              iVar19 = iVar19 + iVar2;
              lVar29 = lVar29 + 1;
            } while (iVar24 != (int)lVar29);
            iVar16 = iVar16 + (int)lVar29;
          }
          iVar19 = iVar19 + (iVar20 * iVar3 - iVar2 * iVar24);
          iVar22 = iVar22 + 1;
        } while (iVar22 != iVar40);
      }
      iVar20 = (int)local_b0;
      uVar32 = local_128._0_4_;
      if ((iVar4 == iVar20) && (local_128._0_4_ == iVar20)) {
        if (0 < (int)local_128._0_4_) {
          local_f8 = *(long *)local_d8._0_8_;
          local_100 = *(long *)(local_d8._0_8_ + 0x10) * *(long *)(local_d8._0_8_ + 0x40);
          pvVar31 = (this->weight_data).data;
          local_108 = (this->bias_data).data;
          local_190 = local_178.data;
          local_1c0 = local_178.cstep * local_178.elemsize;
          lVar29 = (long)local_178.h * (long)local_178.w;
          local_1a8 = 0;
          iVar20 = (int)((local_178.elemsize * lVar29 + 0xf & 0xfffffffffffffff0) /
                        local_178.elemsize);
          if (local_178.dims == 4) {
            iVar20 = (int)lVar29;
          }
          local_f0 = (ulong)(uint)(iVar20 * local_178.d);
          uVar17 = *(uint *)(local_d8._0_8_ + 0x2c);
          uVar5 = *(uint *)(local_d8._0_8_ + 0x30);
          local_1a0 = (ulong)(uint)(local_178.h * local_178.w);
          local_180 = CONCAT71(local_180._1_7_,
                               (long)(this->bias_data).c * (this->bias_data).cstep == 0 ||
                               local_108 == (void *)0x0);
          lVar23 = (long)iVar43 * (long)local_178.w * local_178.elemsize;
          lVar29 = local_f0 - 1;
          local_188 = (ulong)(iVar20 * local_178.d + 3U & 0xfffffffc);
          auVar39._8_4_ = (int)lVar29;
          auVar39._0_8_ = lVar29;
          auVar39._12_4_ = (int)((ulong)lVar29 >> 0x20);
          auVar39 = auVar39 ^ _DAT_00513240;
          local_1b0 = (void *)((long)local_178.data + 0xc);
          pvVar25 = local_178.data;
          auVar34 = _DAT_00513340;
          auVar41 = _DAT_00513350;
          auVar42 = _DAT_00513240;
          local_c8 = auVar39;
          do {
            uVar32 = 0;
            if ((char)local_180 == '\0') {
              uVar32 = *(undefined4 *)((long)local_108 + local_1a8 * 4);
            }
            if (0 < (int)local_f0) {
              uVar18 = 0;
              do {
                auVar36._8_4_ = (int)uVar18;
                auVar36._0_8_ = uVar18;
                auVar36._12_4_ = (int)(uVar18 >> 0x20);
                auVar35 = (auVar36 | auVar41) ^ auVar42;
                iVar24 = auVar39._0_4_;
                bVar9 = iVar24 < auVar35._0_4_;
                iVar20 = auVar35._4_4_;
                iVar40 = auVar39._4_4_;
                if ((bool)(~(iVar40 < iVar20 || iVar20 == iVar40 && bVar9) & 1)) {
                  *(undefined4 *)((long)local_1b0 + uVar18 * 4 + -0xc) = uVar32;
                }
                if (iVar40 >= iVar20 && (iVar20 != iVar40 || !bVar9)) {
                  *(undefined4 *)((long)local_1b0 + uVar18 * 4 + -8) = uVar32;
                }
                auVar35 = (auVar36 | auVar34) ^ auVar42;
                iVar20 = auVar35._4_4_;
                if (iVar20 <= iVar40 && (iVar20 != iVar40 || auVar35._0_4_ <= iVar24)) {
                  *(undefined4 *)((long)local_1b0 + uVar18 * 4 + -4) = uVar32;
                  *(undefined4 *)((long)local_1b0 + uVar18 * 4) = uVar32;
                }
                uVar18 = uVar18 + 4;
              } while (local_188 != uVar18);
            }
            if (0 < (int)uVar5) {
              uVar18 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar26 = 0;
                  do {
                    if (0 < (int)uVar30) {
                      lVar29 = uVar26 * local_90 * 4 + lVar23 * uVar18 + local_1c0 * local_1a8;
                      fVar33 = *(float *)(local_100 * local_1a8 + local_f8 +
                                          uVar18 * (long)(int)uVar17 * 4 + uVar26 * 4);
                      uVar27 = 0;
                      do {
                        *(float *)((long)local_190 +
                                  (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[uVar27] * 4 +
                                  lVar29) =
                             *(float *)((long)pvVar31 + uVar27 * 4) * fVar33 +
                             *(float *)((long)local_190 +
                                       (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start[uVar27] * 4 +
                                       lVar29);
                        uVar27 = uVar27 + 1;
                      } while (uVar30 != uVar27);
                    }
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar17);
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 != uVar5);
            }
            if (0 < (int)local_1a0) {
              pfVar7 = (float *)(this->activation_params).data;
              uVar27 = 0;
              uVar18 = local_1b8;
              uVar26 = local_1a0;
              do {
                fVar33 = *(float *)((long)pvVar25 + uVar27 * 4);
                fVar38 = fVar33;
                switch((int)uVar18) {
                case 1:
                  if (fVar33 <= 0.0) {
                    fVar38 = 0.0;
                  }
                  break;
                case 2:
                  fVar38 = (float)(~-(uint)(0.0 < fVar33) & (uint)*pfVar7 |
                                  -(uint)(0.0 < fVar33) & 0x3f800000) * fVar33;
                  break;
                case 3:
                  if (fVar33 <= *pfVar7) {
                    fVar33 = *pfVar7;
                  }
                  fVar38 = pfVar7[1];
                  if (fVar33 <= pfVar7[1]) {
                    fVar38 = fVar33;
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar33) {
                    fVar33 = 88.37626;
                  }
                  fVar33 = expf((float)(-(uint)(fVar33 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar33 < -88.37626) & ((uint)fVar33 ^ auVar42._0_4_)
                                       ));
                  uVar18 = local_1b8;
                  uVar26 = local_1a0;
                  auVar39 = local_c8;
                  auVar34 = _DAT_00513340;
                  auVar41 = _DAT_00513350;
                  auVar42 = _DAT_00513240;
                  fVar38 = 1.0 / (fVar33 + 1.0);
                  break;
                case 5:
                  local_d8 = ZEXT416((uint)fVar33);
                  fVar33 = expf(fVar33);
                  fVar33 = logf(fVar33 + 1.0);
                  fVar33 = tanhf(fVar33);
                  uVar18 = local_1b8;
                  uVar26 = local_1a0;
                  auVar39 = local_c8;
                  auVar34 = _DAT_00513340;
                  auVar41 = _DAT_00513350;
                  auVar42 = _DAT_00513240;
                  fVar38 = fVar33 * (float)local_d8._0_4_;
                  break;
                case 6:
                  fVar1 = *pfVar7;
                  fVar37 = (float)((uint)pfVar7[1] ^ auVar42._0_4_) / fVar1;
                  fVar38 = 0.0;
                  if ((fVar37 <= fVar33) && (fVar38 = fVar33, fVar33 <= fVar37 + 1.0 / fVar1)) {
                    fVar38 = (fVar1 * fVar33 + pfVar7[1]) * fVar33;
                  }
                }
                *(float *)((long)pvVar25 + uVar27 * 4) = fVar38;
                uVar27 = uVar27 + 1;
              } while (uVar26 != uVar27);
            }
            local_1a8 = local_1a8 + 1;
            local_1b0 = (void *)((long)local_1b0 + local_1c0);
            pvVar31 = (void *)((long)pvVar31 + __n * 4);
            pvVar25 = (void *)((long)pvVar25 + local_1c0);
          } while (local_1a8 != local_128._0_8_);
        }
      }
      else {
        uVar17 = iVar4 / iVar20;
        if (0 < iVar20) {
          uVar18 = (long)((ulong)(uint)((int)uVar32 >> 0x1f) << 0x20 | local_128._0_8_ & 0xffffffff)
                   / (long)iVar20;
          local_188 = uVar18 & 0xffffffff;
          local_e0 = local_178.d;
          local_180 = local_178.cstep * local_178.elemsize;
          local_70 = (long)local_178.h * (long)local_178.w;
          local_78 = local_178.elemsize * local_70 + 0xf & 0xfffffffffffffff0;
          local_e4 = local_178.dims;
          local_1c0 = (ulong)(uint)(local_178.h * local_178.w);
          local_dc = (int)uVar18;
          local_80 = (long)local_dc;
          local_68 = local_178.elemsize;
          local_1a8 = (long)local_178.w * local_178.elemsize * (long)iVar43;
          local_dc = local_dc * iVar24 * iVar40 * uVar17;
          local_60 = local_180 * local_80;
          local_50 = (long)(int)(uVar17 * uVar30) << 2;
          local_88 = (this->weight_data).data;
          local_98 = (this->bias_data).data;
          uVar5 = *(uint *)(local_d8._0_8_ + 0x2c);
          local_1a0 = (ulong)*(uint *)(local_d8._0_8_ + 0x30);
          local_a0 = (long)local_178.data + 0xc;
          local_110 = 0;
          local_58 = local_178.data;
          local_a8 = local_178.data;
          local_118 = 0;
          auVar34 = _DAT_00513340;
          auVar39 = _DAT_00513350;
          auVar41 = _DAT_00513240;
          do {
            if (0 < (int)local_188) {
              local_1d0 = (void *)((long)local_88 + (long)(int)local_110 * 4);
              local_190 = (void *)(local_118 * local_80);
              iVar20 = (int)local_70;
              if (local_e4 != 4) {
                iVar20 = (int)(local_78 / local_68);
              }
              local_100 = (ulong)(uint)(iVar20 * local_e0);
              iVar24 = (int)local_118;
              local_f8 = CONCAT71(local_f8._1_7_,
                                  (long)(this->bias_data).c * (this->bias_data).cstep == 0 ||
                                  local_98 == (void *)0x0);
              local_108 = (void *)(ulong)(iVar20 * local_e0 + 3U & 0xfffffffc);
              lVar29 = local_100 - 1;
              auVar42._8_4_ = (int)lVar29;
              auVar42._0_8_ = lVar29;
              auVar42._12_4_ = (int)((ulong)lVar29 >> 0x20);
              auVar42 = auVar42 ^ auVar41;
              local_1d8 = local_a0;
              uVar18 = 0;
              pvVar31 = local_a8;
              local_128 = auVar42;
              do {
                uVar32 = 0;
                if ((char)local_f8 == '\0') {
                  uVar32 = *(undefined4 *)((long)local_98 + (uVar18 + (long)local_190) * 4);
                }
                if (0 < (int)local_100) {
                  pvVar25 = (void *)0x0;
                  do {
                    auVar35._8_4_ = (int)pvVar25;
                    auVar35._0_8_ = pvVar25;
                    auVar35._12_4_ = (int)((ulong)pvVar25 >> 0x20);
                    auVar36 = (auVar35 | auVar39) ^ auVar41;
                    iVar40 = auVar42._0_4_;
                    bVar9 = iVar40 < auVar36._0_4_;
                    iVar20 = auVar36._4_4_;
                    iVar43 = auVar42._4_4_;
                    if ((bool)(~(iVar43 < iVar20 || iVar20 == iVar43 && bVar9) & 1)) {
                      *(undefined4 *)(local_1d8 + -0xc + (long)pvVar25 * 4) = uVar32;
                    }
                    if (iVar43 >= iVar20 && (iVar20 != iVar43 || !bVar9)) {
                      *(undefined4 *)(local_1d8 + -8 + (long)pvVar25 * 4) = uVar32;
                    }
                    auVar35 = (auVar35 | auVar34) ^ auVar41;
                    iVar20 = auVar35._4_4_;
                    if (iVar20 <= iVar43 && (iVar20 != iVar43 || auVar35._0_4_ <= iVar40)) {
                      *(undefined4 *)(local_1d8 + -4 + (long)pvVar25 * 4) = uVar32;
                      *(undefined4 *)(local_1d8 + (long)pvVar25 * 4) = uVar32;
                    }
                    pvVar25 = (void *)((long)pvVar25 + 4);
                  } while (local_108 != pvVar25);
                }
                if (0 < (int)local_1a0) {
                  pvVar25 = (void *)((uVar18 + (long)local_190) * local_180 + (long)local_58);
                  local_c8._0_8_ = pvVar25;
                  local_1f0 = 0;
                  do {
                    if (0 < (int)uVar5) {
                      iVar20 = *(int *)(local_d8._0_8_ + 0x2c);
                      lVar29 = *(long *)(local_d8._0_8_ + 0x10);
                      lVar23 = *(long *)(local_d8._0_8_ + 0x40);
                      lVar8 = *(long *)local_d8._0_8_;
                      uVar26 = 0;
                      do {
                        if (0 < (int)uVar17) {
                          lVar14 = uVar26 * local_90 * 4 + local_1a8 * local_1f0;
                          uVar27 = 0;
                          pvVar28 = local_1d0;
                          do {
                            if (0 < (int)uVar30) {
                              fVar33 = *(float *)((long)iVar20 * local_1f0 * lVar29 + lVar8 +
                                                  uVar26 * 4 +
                                                 (uVar27 + uVar17 * iVar24) * lVar23 * lVar29);
                              uVar21 = 0;
                              do {
                                *(float *)((long)pvVar25 +
                                          (long)local_48.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[uVar21] * 4
                                          + lVar14) =
                                     *(float *)((long)pvVar28 + uVar21 * 4) * fVar33 +
                                     *(float *)((long)pvVar25 +
                                               (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar21] *
                                               4 + lVar14);
                                uVar21 = uVar21 + 1;
                              } while (uVar30 != uVar21);
                            }
                            uVar27 = uVar27 + 1;
                            pvVar28 = (void *)((long)pvVar28 + __n * 4);
                          } while (uVar27 != uVar17);
                        }
                        uVar26 = uVar26 + 1;
                      } while (uVar26 != uVar5);
                    }
                    local_1f0 = local_1f0 + 1;
                  } while (local_1f0 != local_1a0);
                }
                local_1b0 = pvVar31;
                local_f0 = uVar18;
                if (0 < (int)local_1c0) {
                  pfVar7 = (float *)(this->activation_params).data;
                  uVar27 = 0;
                  uVar18 = local_1b8;
                  uVar26 = local_1c0;
                  do {
                    fVar33 = *(float *)((long)pvVar31 + uVar27 * 4);
                    fVar38 = fVar33;
                    switch((int)uVar18) {
                    case 1:
                      if (fVar33 <= 0.0) {
                        fVar38 = 0.0;
                      }
                      break;
                    case 2:
                      fVar38 = (float)(~-(uint)(0.0 < fVar33) & (uint)*pfVar7 |
                                      -(uint)(0.0 < fVar33) & 0x3f800000) * fVar33;
                      break;
                    case 3:
                      if (fVar33 <= *pfVar7) {
                        fVar33 = *pfVar7;
                      }
                      fVar38 = pfVar7[1];
                      if (fVar33 <= pfVar7[1]) {
                        fVar38 = fVar33;
                      }
                      break;
                    case 4:
                      if (88.37626 <= fVar33) {
                        fVar33 = 88.37626;
                      }
                      fVar33 = expf((float)(-(uint)(fVar33 < -88.37626) & 0x42b0c0a5 |
                                           ~-(uint)(fVar33 < -88.37626) &
                                           ((uint)fVar33 ^ auVar41._0_4_)));
                      uVar18 = local_1b8;
                      pvVar31 = local_1b0;
                      uVar26 = local_1c0;
                      auVar34 = _DAT_00513340;
                      auVar39 = _DAT_00513350;
                      auVar41 = _DAT_00513240;
                      auVar42 = local_128;
                      fVar38 = 1.0 / (fVar33 + 1.0);
                      break;
                    case 5:
                      local_c8 = ZEXT416((uint)fVar33);
                      fVar33 = expf(fVar33);
                      fVar33 = logf(fVar33 + 1.0);
                      fVar33 = tanhf(fVar33);
                      uVar18 = local_1b8;
                      pvVar31 = local_1b0;
                      uVar26 = local_1c0;
                      auVar34 = _DAT_00513340;
                      auVar39 = _DAT_00513350;
                      auVar41 = _DAT_00513240;
                      auVar42 = local_128;
                      fVar38 = fVar33 * (float)local_c8._0_4_;
                      break;
                    case 6:
                      fVar1 = *pfVar7;
                      fVar37 = (float)((uint)pfVar7[1] ^ auVar41._0_4_) / fVar1;
                      fVar38 = 0.0;
                      if ((fVar37 <= fVar33) && (fVar38 = fVar33, fVar33 <= fVar37 + 1.0 / fVar1)) {
                        fVar38 = (fVar1 * fVar33 + pfVar7[1]) * fVar33;
                      }
                    }
                    *(float *)((long)pvVar31 + uVar27 * 4) = fVar38;
                    uVar27 = uVar27 + 1;
                  } while (uVar26 != uVar27);
                }
                uVar18 = local_f0 + 1;
                local_1d8 = local_1d8 + local_180;
                local_1d0 = (void *)((long)local_1d0 + local_50);
                pvVar31 = (void *)((long)pvVar31 + local_180);
              } while (uVar18 != local_188);
            }
            local_118 = local_118 + 1;
            local_a0 = local_a0 + local_60;
            local_110 = (ulong)(uint)((int)local_110 + local_dc);
            local_a8 = (void *)((long)local_a8 + local_60);
          } while (local_118 != local_b0);
        }
      }
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      cut_padding(this,&local_178,local_198,local_b8);
      if ((local_198->data == (void *)0x0) ||
         (iVar24 = 0, (long)local_198->c * local_198->cstep == 0)) {
        iVar24 = -100;
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar24;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}